

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_EscapeEncoding.cpp
# Opt level: O2

size_t axl::enc::EscapeEncodingDynamic::encode
                 (CharCodec *codec,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,void *p0,
                 size_t size,uint_t flags)

{
  int c;
  bool bVar1;
  utf32_t uVar2;
  size_t sVar3;
  void *pvVar4;
  int *p;
  int *piVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  char escapeSequence [16];
  uint32_t decoderState;
  Array<char,_axl::sl::ArrayDetails<char>_> encodeBuffer;
  utf32_t decodeBuffer [64];
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear(buffer);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve(buffer,size);
  encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count = 0;
  encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = (char *)0x0;
  encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_hdr = (Hdr *)0x0;
  escapeSequence[0] = '\\';
  escapeSequence[1] = '\0';
  escapeSequence[2] = '\0';
  escapeSequence[3] = '\0';
  escapeSequence[4] = '\0';
  escapeSequence[5] = '\0';
  escapeSequence[6] = '\0';
  escapeSequence[7] = '\0';
  escapeSequence[8] = '\0';
  escapeSequence[9] = '\0';
  escapeSequence[10] = '\0';
  escapeSequence[0xb] = '\0';
  escapeSequence[0xc] = '\0';
  escapeSequence[0xd] = '\0';
  escapeSequence[0xe] = '\0';
  escapeSequence[0xf] = '\0';
  decoderState = 0;
  pvVar4 = (void *)(size + (long)p0);
  while (p = decodeBuffer, p0 < pvVar4) {
    auVar7 = (**(code **)(*(long *)codec + 0x98))
                       (codec,&decoderState,p,0x40,p0,(long)pvVar4 - (long)p0,0xfffd);
    if (auVar7._8_8_ == 0) break;
    p0 = (void *)((long)p0 + auVar7._8_8_);
    piVar6 = p;
    for (piVar5 = p; piVar5 < decodeBuffer + auVar7._0_8_; piVar5 = piVar5 + 1) {
      c = *piVar5;
      if (c == 0x5c) {
        escapeSequence[1] = '\\';
        appendEncoded_utf32(codec,buffer,&encodeBuffer,p,(long)piVar6 - (long)p >> 2);
        appendEncoded_utf8(codec,buffer,&encodeBuffer,escapeSequence,2);
LAB_00142789:
        p = piVar5 + 1;
      }
      else {
        bVar1 = isPrintable(c);
        if ((!bVar1) && (uVar2 = EscapeEncodingRoot::findEscapeChar(c,flags), uVar2 != 0)) {
          appendEncoded_utf32(codec,buffer,&encodeBuffer,p,(long)piVar6 - (long)p >> 2);
          if (uVar2 == c) {
            if ((flags & 1) == 0) {
              sVar3 = EscapeEncodingRoot::buildHexCodeEscapeSequence<axl::enc::GetHexChar_l,char>
                                (escapeSequence,c);
            }
            else {
              sVar3 = EscapeEncodingRoot::buildHexCodeEscapeSequence<axl::enc::GetHexChar_u,char>
                                (escapeSequence,c);
            }
          }
          else {
            escapeSequence[1] = (char)uVar2;
            sVar3 = 2;
          }
          appendEncoded_utf8(codec,buffer,&encodeBuffer,escapeSequence,sVar3);
          goto LAB_00142789;
        }
      }
      piVar6 = piVar6 + 1;
    }
    appendEncoded_utf32(codec,buffer,&encodeBuffer,p,(long)piVar6 - (long)p >> 2);
  }
  sVar3 = (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
            (&encodeBuffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
  return sVar3;
}

Assistant:

size_t
EscapeEncodingDynamic::encode(
	CharCodec* codec,
	sl::Array<char>* buffer,
	const void* p0,
	size_t size,
	uint_t flags
) {
	buffer->clear();
	buffer->reserve(size);

	sl::Array<char> encodeBuffer;
	char escapeSequence[16] = { '\\' };

	uint32_t decoderState = 0;
	const char* src = (char*)p0;
	const char* srcEnd = src + size;

	while (src < srcEnd) {
		utf32_t decodeBuffer[64];

		ConvertLengthResult result = codec->decode_utf32(
			&decoderState,
			decodeBuffer,
			countof(decodeBuffer),
			src,
			srcEnd - src
		);

		if (!result.m_srcLength)
			break;

		src += result.m_srcLength;

		const utf32_t* p = decodeBuffer;
		const utf32_t* end = p + result.m_dstLength;
		const utf32_t* base = p;

		for (; p < end; p++) {
			utf32_t c = *p;

			if (c == '\\') {
				escapeSequence[1] = '\\';
				appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
				appendEncoded_utf8(codec, buffer, &encodeBuffer, escapeSequence, 2);
				base = p + 1;
			} else {
				if (isPrintable(c))
					continue;

				utf32_t escape = findEscapeChar(c, flags);
				if (!escape)
					continue;

				appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);

				size_t escapeSequenceLength;
				if (escape != c) {
					escapeSequence[1] = (char)escape;
					escapeSequenceLength = 2;
				} else {
					escapeSequenceLength = (flags & EscapeEncodingFlag_UpperCase) ?
						buildHexCodeEscapeSequence<GetHexChar_u>(escapeSequence, c) :
						buildHexCodeEscapeSequence<GetHexChar_l>(escapeSequence, c);
				}

				appendEncoded_utf8(codec, buffer, &encodeBuffer, escapeSequence, escapeSequenceLength);
				base = p + 1;
			}
		}

		appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
	}

	return buffer->getCount();
}